

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

void __thiscall TestHarness::AddType(TestHarness *this,int type,int weight,char *name)

{
  undefined1 local_48 [8];
  Type t;
  
  local_48 = (undefined1  [8])&t.name._M_string_length;
  t.name._M_dataplus._M_p = (pointer)0x0;
  t.name._M_string_length._0_1_ = 0;
  std::__cxx11::string::assign(local_48);
  t.name.field_2._8_4_ = type;
  t.name.field_2._12_4_ = weight;
  std::vector<TestHarness::Type,_std::allocator<TestHarness::Type>_>::push_back
            (&this->types_,(value_type *)local_48);
  this->total_weight_ = this->total_weight_ + weight;
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void TestHarness::AddType(int type, int weight, const char* name) {
  Type t;
  t.name = name;
  t.type = type;
  t.weight = weight;
  types_.push_back(t);
  total_weight_ += weight;
}